

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall gulcalc::clearmode1_data(gulcalc *this)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    std::vector<processrecData,_std::allocator<processrecData>_>::clear
              ((this->mode1_stats_).
               super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *piVar2);
    piVar1 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  piVar2 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != piVar2) {
    (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  return;
}

Assistant:

void gulcalc::clearmode1_data() {

	auto iter = mode1UsedCoverageIDs_.begin();
	while (iter != mode1UsedCoverageIDs_.end()) {
		mode1_stats_[*iter].clear();
		iter++;
	}
	mode1UsedCoverageIDs_.clear();
}